

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

int xmlExcC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns,xmlC14NCtxPtr ctx)

{
  xmlChar *pxVar1;
  char cVar2;
  char cVar3;
  xmlChar xVar4;
  xmlNodePtr pxVar5;
  uint uVar6;
  _xmlNode *p_Var7;
  xmlChar *pxVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  xmlChar *pxVar12;
  _xmlNode *p_Var13;
  int unaff_R14D;
  bool bVar14;
  bool bVar15;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    uVar6 = 0;
    xmlC14NErrFull(ctx,(xmlNodePtr)0x0,0x73,(char *)0x0,"Invalid argument\n",0);
  }
  else {
    p_Var13 = (_xmlNode *)0x1e3623;
    if (ns != (xmlNsPtr)0x0) {
      p_Var13 = (_xmlNode *)0x1e3623;
      if ((_xmlNode *)ns->prefix != (_xmlNode *)0x0) {
        p_Var13 = (_xmlNode *)ns->prefix;
      }
    }
    pxVar12 = "";
    if (ns != (xmlNsPtr)0x0) {
      pxVar12 = "";
      if (ns->href != (xmlChar *)0x0) {
        pxVar12 = ns->href;
      }
    }
    uVar6 = 0;
    if (*(char *)&p_Var13->_private == '\0') {
      uVar6 = (uint)(*pxVar12 == '\0');
    }
    if (cur->nsTab != (xmlNsPtr *)0x0) {
      uVar11 = (ulong)(uint)cur->nsCurEnd;
      do {
        iVar10 = (int)uVar11;
        if (iVar10 < 1) break;
        pxVar5 = (xmlNodePtr)cur->nsTab[uVar11 - 1];
        if (pxVar5 == (xmlNodePtr)0x0) {
          p_Var7 = (_xmlNode *)0x0;
        }
        else {
          p_Var7 = pxVar5->children;
        }
        if (p_Var13 == p_Var7) {
          bVar14 = true;
        }
        else if (p_Var7 == (_xmlNode *)0x0) {
          bVar14 = *(char *)&p_Var13->_private == '\0';
        }
        else {
          lVar9 = 0;
          do {
            cVar2 = *(char *)((long)&p_Var13->_private + lVar9);
            cVar3 = *(char *)((long)&p_Var7->_private + lVar9);
            bVar14 = cVar2 == cVar3;
            if (cVar3 == '\0') break;
            lVar9 = lVar9 + 1;
          } while (cVar2 == cVar3);
        }
        if (bVar14) {
          if (pxVar5 == (xmlNodePtr)0x0) {
            pxVar8 = (xmlChar *)0x0;
          }
          else {
            pxVar8 = pxVar5->name;
          }
          if (pxVar12 != pxVar8) {
            if (pxVar8 == (xmlChar *)0x0) {
              bVar15 = *pxVar12 == '\0';
            }
            else {
              lVar9 = 0;
              do {
                pxVar1 = pxVar12 + lVar9;
                xVar4 = pxVar8[lVar9];
                bVar15 = *pxVar1 == xVar4;
                if (xVar4 == '\0') break;
                lVar9 = lVar9 + 1;
              } while (*pxVar1 == xVar4);
            }
            unaff_R14D = 0;
            if (!bVar15) goto LAB_00162d29;
          }
          if (ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) {
            unaff_R14D = 1;
          }
          else {
            unaff_R14D = (*ctx->is_visible_callback)(ctx->user_data,pxVar5,cur->nodeTab[uVar11 - 1])
            ;
          }
        }
LAB_00162d29:
        uVar11 = uVar11 - 1;
      } while (!bVar14);
      if (0 < iVar10) {
        return unaff_R14D;
      }
    }
  }
  return uVar6;
}

Assistant:

static int
xmlExcC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns, xmlC14NCtxPtr ctx) {
    int i;
    const xmlChar *prefix;
    const xmlChar *href;
    int has_empty_ns;

    if(cur == NULL) {
        xmlC14NErrParam(ctx);
        return (0);
    }

    /*
     * if the default namespace xmlns="" is not defined yet then
     * we do not want to print it out
     */
    prefix = ((ns == NULL) || (ns->prefix == NULL)) ? BAD_CAST "" : ns->prefix;
    href = ((ns == NULL) || (ns->href == NULL)) ? BAD_CAST "" : ns->href;
    has_empty_ns = (xmlC14NStrEqual(prefix, NULL) && xmlC14NStrEqual(href, NULL));

    if (cur->nsTab != NULL) {
	int start = 0;
        for (i = cur->nsCurEnd - 1; i >= start; --i) {
            xmlNsPtr ns1 = cur->nsTab[i];

	    if(xmlC14NStrEqual(prefix, (ns1 != NULL) ? ns1->prefix : NULL)) {
		if(xmlC14NStrEqual(href, (ns1 != NULL) ? ns1->href : NULL)) {
		    return(xmlC14NIsVisible(ctx, ns1, cur->nodeTab[i]));
		} else {
		    return(0);
		}
	    }
        }
    }
    return(has_empty_ns);
}